

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_257,_false,_embree::avx512::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  NodeRef root;
  ulong uVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  undefined8 uVar12;
  size_t k;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  byte bVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  char cVar24;
  byte bVar25;
  byte bVar26;
  size_t mask;
  ulong uVar27;
  undefined4 uVar28;
  long lVar29;
  ulong *puVar30;
  uint uVar31;
  undefined1 (*pauVar32) [32];
  bool bVar33;
  byte bVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar39 [16];
  int iVar38;
  int iVar51;
  int iVar52;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar40 [16];
  undefined1 auVar43 [32];
  int iVar53;
  int iVar57;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 in_ZMM1 [64];
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar61 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 in_ZMM4 [64];
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar72 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  vfloat4 a0;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5be0;
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [8];
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  undefined4 uStack_5b24;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  uint local_5a40;
  uint uStack_5a3c;
  uint uStack_5a38;
  uint uStack_5a34;
  uint uStack_5a30;
  uint uStack_5a2c;
  uint uStack_5a28;
  uint uStack_5a24;
  uint local_5a20;
  uint uStack_5a1c;
  uint uStack_5a18;
  uint uStack_5a14;
  uint uStack_5a10;
  uint uStack_5a0c;
  uint uStack_5a08;
  uint uStack_5a04;
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar46 = *(undefined1 (*) [32])(ray + 0x100);
    auVar42 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar35 = vcmpps_avx512vl(auVar46,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar27 = vpcmpeqd_avx512vl(auVar42,(undefined1  [32])valid_i->field_0);
    uVar35 = uVar35 & uVar27;
    bVar34 = (byte)uVar35;
    if (bVar34 != 0) {
      local_5b80 = *(undefined1 (*) [32])(ray + 0x80);
      local_5b60 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5b40 = *(undefined1 (*) [32])(ray + 0xc0);
      fVar11 = local_5b40._0_4_;
      auVar90._0_4_ = fVar11 * fVar11;
      fVar60 = local_5b40._4_4_;
      auVar90._4_4_ = fVar60 * fVar60;
      fVar62 = local_5b40._8_4_;
      auVar90._8_4_ = fVar62 * fVar62;
      fVar63 = local_5b40._12_4_;
      auVar90._12_4_ = fVar63 * fVar63;
      fVar64 = local_5b40._16_4_;
      auVar90._16_4_ = fVar64 * fVar64;
      fVar65 = local_5b40._20_4_;
      auVar90._20_4_ = fVar65 * fVar65;
      fVar66 = local_5b40._24_4_;
      auVar90._28_36_ = in_ZMM4._28_36_;
      auVar90._24_4_ = fVar66 * fVar66;
      auVar81 = vfmadd231ps_fma(auVar90._0_32_,local_5b60,local_5b60);
      auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_5b80,local_5b80);
      auVar41 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
      auVar42._8_4_ = 0xbf000000;
      auVar42._0_8_ = 0xbf000000bf000000;
      auVar42._12_4_ = 0xbf000000;
      auVar42._16_4_ = 0xbf000000;
      auVar42._20_4_ = 0xbf000000;
      auVar42._24_4_ = 0xbf000000;
      auVar42._28_4_ = 0xbf000000;
      auVar42 = vmulps_avx512vl(ZEXT1632(auVar81),auVar42);
      fVar67 = auVar41._0_4_;
      fVar75 = auVar41._4_4_;
      fVar76 = auVar41._8_4_;
      fVar77 = auVar41._12_4_;
      fVar78 = auVar41._16_4_;
      fVar79 = auVar41._20_4_;
      fVar80 = auVar41._24_4_;
      auVar81._0_4_ = fVar67 * fVar67;
      auVar81._4_4_ = fVar75 * fVar75;
      auVar81._8_4_ = fVar76 * fVar76;
      auVar81._12_4_ = fVar77 * fVar77;
      auVar45._4_4_ = auVar81._4_4_ * fVar75 * auVar42._4_4_;
      auVar45._0_4_ = auVar81._0_4_ * fVar67 * auVar42._0_4_;
      auVar45._8_4_ = auVar81._8_4_ * fVar76 * auVar42._8_4_;
      auVar45._12_4_ = auVar81._12_4_ * fVar77 * auVar42._12_4_;
      auVar45._16_4_ = fVar78 * fVar78 * fVar78 * auVar42._16_4_;
      auVar45._20_4_ = fVar79 * fVar79 * fVar79 * auVar42._20_4_;
      auVar45._24_4_ = fVar80 * fVar80 * fVar80 * auVar42._24_4_;
      auVar45._28_4_ = auVar42._28_4_;
      auVar43._8_4_ = 0x3fc00000;
      auVar43._0_8_ = 0x3fc000003fc00000;
      auVar43._12_4_ = 0x3fc00000;
      auVar43._16_4_ = 0x3fc00000;
      auVar43._20_4_ = 0x3fc00000;
      auVar43._24_4_ = 0x3fc00000;
      auVar43._28_4_ = 0x3fc00000;
      local_59c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar45,auVar41,auVar43);
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar72._12_4_ = 0;
      auVar72._0_12_ = ZEXT812(0);
      auVar72 = auVar72 << 0x20;
      auVar81 = vpcmpeqd_avx(auVar81,auVar81);
      uVar27 = uVar35;
      do {
        lVar29 = 0;
        for (uVar37 = uVar27; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
          lVar29 = lVar29 + 1;
        }
        uVar37 = (ulong)(uint)((int)lVar29 * 4);
        auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar37 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar37 + 0xa0)),0x1c);
        fVar67 = *(float *)((long)&local_59c0 + uVar37);
        auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + uVar37 + 0xc0)),0x28);
        auVar88._0_4_ = auVar39._0_4_ * fVar67;
        auVar88._4_4_ = auVar39._4_4_ * fVar67;
        auVar88._8_4_ = auVar39._8_4_ * fVar67;
        auVar88._12_4_ = auVar39._12_4_ * fVar67;
        auVar39 = vshufpd_avx(auVar88,auVar88,1);
        auVar89 = vmovshdup_avx(auVar88);
        auVar92 = vunpckhps_avx(auVar88,auVar72);
        auVar40._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
        auVar40._8_8_ = auVar39._8_8_ ^ auVar69._8_8_;
        auVar40 = vinsertps_avx(auVar40,auVar88,0x2a);
        auVar39 = vdpps_avx(auVar40,auVar40,0x7f);
        auVar92 = vshufps_avx(auVar92,ZEXT416(auVar89._0_4_ ^ 0x80000000),0x41);
        auVar89 = vdpps_avx(auVar92,auVar92,0x7f);
        uVar12 = vcmpps_avx512vl(auVar39,auVar89,1);
        auVar39 = vpmovm2d_avx512vl(uVar12);
        auVar96._0_4_ = auVar39._0_4_;
        auVar96._4_4_ = auVar96._0_4_;
        auVar96._8_4_ = auVar96._0_4_;
        auVar96._12_4_ = auVar96._0_4_;
        uVar37 = vpmovd2m_avx512vl(auVar96);
        auVar39._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar81._4_4_;
        auVar39._0_4_ = (uint)((byte)uVar37 & 1) * auVar81._0_4_;
        auVar39._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar81._8_4_;
        auVar39._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar81._12_4_;
        auVar39 = vblendvps_avx(auVar40,auVar92,auVar39);
        auVar89 = vdpps_avx(auVar39,auVar39,0x7f);
        auVar40 = vrsqrt14ss_avx512f(auVar72,ZEXT416((uint)auVar89._0_4_));
        fVar75 = auVar40._0_4_;
        fVar75 = fVar75 * 1.5 - auVar89._0_4_ * 0.5 * fVar75 * fVar75 * fVar75;
        auVar92._0_4_ = auVar39._0_4_ * fVar75;
        auVar92._4_4_ = auVar39._4_4_ * fVar75;
        auVar92._8_4_ = auVar39._8_4_ * fVar75;
        auVar92._12_4_ = auVar39._12_4_ * fVar75;
        auVar39 = vshufps_avx(auVar92,auVar92,0xc9);
        auVar89 = vshufps_avx(auVar88,auVar88,0xc9);
        auVar97._0_4_ = auVar92._0_4_ * auVar89._0_4_;
        auVar97._4_4_ = auVar92._4_4_ * auVar89._4_4_;
        auVar97._8_4_ = auVar92._8_4_ * auVar89._8_4_;
        auVar97._12_4_ = auVar92._12_4_ * auVar89._12_4_;
        auVar39 = vfmsub231ps_fma(auVar97,auVar88,auVar39);
        lVar29 = lVar29 * 0x30;
        auVar89 = vshufps_avx(auVar39,auVar39,0xc9);
        auVar39 = vdpps_avx(auVar89,auVar89,0x7f);
        uVar27 = uVar27 - 1 & uVar27;
        auVar40 = vrsqrt14ss_avx512f(auVar72,ZEXT416((uint)auVar39._0_4_));
        fVar75 = auVar40._0_4_;
        fVar75 = fVar75 * 1.5 - auVar39._0_4_ * 0.5 * fVar75 * fVar75 * fVar75;
        auVar94._0_4_ = fVar75 * auVar89._0_4_;
        auVar94._4_4_ = fVar75 * auVar89._4_4_;
        auVar94._8_4_ = fVar75 * auVar89._8_4_;
        auVar94._12_4_ = fVar75 * auVar89._12_4_;
        auVar89._0_4_ = fVar67 * auVar88._0_4_;
        auVar89._4_4_ = fVar67 * auVar88._4_4_;
        auVar89._8_4_ = fVar67 * auVar88._8_4_;
        auVar89._12_4_ = fVar67 * auVar88._12_4_;
        auVar40 = vunpcklps_avx(auVar92,auVar89);
        auVar39 = vunpckhps_avx(auVar92,auVar89);
        auVar92 = vunpcklps_avx(auVar94,auVar72);
        auVar89 = vunpckhps_avx(auVar94,auVar72);
        auVar89 = vunpcklps_avx(auVar39,auVar89);
        auVar90 = ZEXT1664(auVar89);
        auVar88 = vunpcklps_avx(auVar40,auVar92);
        auVar39 = vunpckhps_avx(auVar40,auVar92);
        *(undefined1 (*) [16])(local_59a0 + lVar29) = auVar88;
        *(undefined1 (*) [16])(auStack_5990 + lVar29) = auVar39;
        *(undefined1 (*) [16])(auStack_5980 + lVar29) = auVar89;
      } while (uVar27 != 0);
      local_5be0._0_4_ = *(undefined4 *)ray;
      local_5be0._4_4_ = *(undefined4 *)(ray + 4);
      local_5be0._8_4_ = *(undefined4 *)(ray + 8);
      local_5be0._12_4_ = *(undefined4 *)(ray + 0xc);
      local_5be0._16_4_ = *(undefined4 *)(ray + 0x10);
      local_5be0._20_4_ = *(undefined4 *)(ray + 0x14);
      local_5be0._24_4_ = *(undefined4 *)(ray + 0x18);
      local_5be0._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5be0._32_4_ = *(undefined4 *)(ray + 0x20);
      local_5be0._36_4_ = *(undefined4 *)(ray + 0x24);
      local_5be0._40_4_ = *(undefined4 *)(ray + 0x28);
      local_5be0._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_5be0._48_4_ = *(undefined4 *)(ray + 0x30);
      local_5be0._52_4_ = *(undefined4 *)(ray + 0x34);
      local_5be0._56_4_ = *(undefined4 *)(ray + 0x38);
      local_5be0._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5be0._64_4_ = *(undefined4 *)(ray + 0x40);
      local_5be0._68_4_ = *(undefined4 *)(ray + 0x44);
      local_5be0._72_4_ = *(undefined4 *)(ray + 0x48);
      local_5be0._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_5be0._80_4_ = *(undefined4 *)(ray + 0x50);
      local_5be0._84_4_ = *(undefined4 *)(ray + 0x54);
      local_5be0._88_4_ = *(undefined4 *)(ray + 0x58);
      local_5be0._92_4_ = *(undefined4 *)(ray + 0x5c);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar98 = ZEXT3264(auVar42);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar99 = ZEXT3264(auVar43);
      vandps_avx512vl(local_5b80,auVar42);
      uVar27 = vcmpps_avx512vl(auVar43,auVar43,1);
      bVar33 = (bool)((byte)uVar27 & 1);
      iVar38 = auVar43._0_4_;
      auVar41._0_4_ = (uint)bVar33 * iVar38 | (uint)!bVar33 * local_5b80._0_4_;
      bVar33 = (bool)((byte)(uVar27 >> 1) & 1);
      iVar51 = auVar43._4_4_;
      auVar41._4_4_ = (uint)bVar33 * iVar51 | (uint)!bVar33 * local_5b80._4_4_;
      bVar33 = (bool)((byte)(uVar27 >> 2) & 1);
      iVar52 = auVar43._8_4_;
      auVar41._8_4_ = (uint)bVar33 * iVar52 | (uint)!bVar33 * local_5b80._8_4_;
      bVar33 = (bool)((byte)(uVar27 >> 3) & 1);
      iVar53 = auVar43._12_4_;
      auVar41._12_4_ = (uint)bVar33 * iVar53 | (uint)!bVar33 * local_5b80._12_4_;
      bVar33 = (bool)((byte)(uVar27 >> 4) & 1);
      iVar54 = auVar43._16_4_;
      auVar41._16_4_ = (uint)bVar33 * iVar54 | (uint)!bVar33 * local_5b80._16_4_;
      bVar33 = (bool)((byte)(uVar27 >> 5) & 1);
      iVar55 = auVar43._20_4_;
      auVar41._20_4_ = (uint)bVar33 * iVar55 | (uint)!bVar33 * local_5b80._20_4_;
      bVar33 = (bool)((byte)(uVar27 >> 6) & 1);
      iVar56 = auVar43._24_4_;
      iVar57 = auVar43._28_4_;
      auVar41._24_4_ = (uint)bVar33 * iVar56 | (uint)!bVar33 * local_5b80._24_4_;
      bVar33 = SUB81(uVar27 >> 7,0);
      auVar41._28_4_ = (uint)bVar33 * iVar57 | (uint)!bVar33 * local_5b80._28_4_;
      vandps_avx512vl(local_5b60,auVar42);
      uVar27 = vcmpps_avx512vl(auVar41,auVar43,1);
      bVar33 = (bool)((byte)uVar27 & 1);
      auVar50._0_4_ = (uint)bVar33 * iVar38 | (uint)!bVar33 * local_5b60._0_4_;
      bVar33 = (bool)((byte)(uVar27 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar33 * iVar51 | (uint)!bVar33 * local_5b60._4_4_;
      bVar33 = (bool)((byte)(uVar27 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar33 * iVar52 | (uint)!bVar33 * local_5b60._8_4_;
      bVar33 = (bool)((byte)(uVar27 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar33 * iVar53 | (uint)!bVar33 * local_5b60._12_4_;
      bVar33 = (bool)((byte)(uVar27 >> 4) & 1);
      auVar50._16_4_ = (uint)bVar33 * iVar54 | (uint)!bVar33 * local_5b60._16_4_;
      bVar33 = (bool)((byte)(uVar27 >> 5) & 1);
      auVar50._20_4_ = (uint)bVar33 * iVar55 | (uint)!bVar33 * local_5b60._20_4_;
      bVar33 = (bool)((byte)(uVar27 >> 6) & 1);
      auVar50._24_4_ = (uint)bVar33 * iVar56 | (uint)!bVar33 * local_5b60._24_4_;
      bVar33 = SUB81(uVar27 >> 7,0);
      auVar50._28_4_ = (uint)bVar33 * iVar57 | (uint)!bVar33 * local_5b60._28_4_;
      vandps_avx512vl(_local_5b40,auVar42);
      uVar27 = vcmpps_avx512vl(auVar50,auVar43,1);
      bVar33 = (bool)((byte)uVar27 & 1);
      auVar44._0_4_ = (uint)bVar33 * iVar38 | (uint)!bVar33 * (int)fVar11;
      bVar33 = (bool)((byte)(uVar27 >> 1) & 1);
      auVar44._4_4_ = (uint)bVar33 * iVar51 | (uint)!bVar33 * (int)fVar60;
      bVar33 = (bool)((byte)(uVar27 >> 2) & 1);
      auVar44._8_4_ = (uint)bVar33 * iVar52 | (uint)!bVar33 * (int)fVar62;
      bVar33 = (bool)((byte)(uVar27 >> 3) & 1);
      auVar44._12_4_ = (uint)bVar33 * iVar53 | (uint)!bVar33 * (int)fVar63;
      bVar33 = (bool)((byte)(uVar27 >> 4) & 1);
      auVar44._16_4_ = (uint)bVar33 * iVar54 | (uint)!bVar33 * (int)fVar64;
      bVar33 = (bool)((byte)(uVar27 >> 5) & 1);
      auVar44._20_4_ = (uint)bVar33 * iVar55 | (uint)!bVar33 * (int)fVar65;
      bVar33 = (bool)((byte)(uVar27 >> 6) & 1);
      auVar44._24_4_ = (uint)bVar33 * iVar56 | (uint)!bVar33 * (int)fVar66;
      bVar33 = SUB81(uVar27 >> 7,0);
      auVar44._28_4_ = (uint)bVar33 * iVar57 | (uint)!bVar33 * local_5b40._28_4_;
      auVar42 = vrcp14ps_avx512vl(auVar41);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar100 = ZEXT3264(auVar43);
      auVar39 = ZEXT816(0);
      auVar87 = ZEXT1664(auVar39);
      auVar45 = vfnmadd213ps_avx512vl(auVar41,auVar42,auVar43);
      auVar81 = vfmadd132ps_fma(auVar45,auVar42,auVar42);
      auVar42 = vrcp14ps_avx512vl(auVar50);
      auVar45 = vfnmadd213ps_avx512vl(auVar50,auVar42,auVar43);
      auVar72 = vfmadd132ps_fma(auVar45,auVar42,auVar42);
      auVar42 = vrcp14ps_avx512vl(auVar44);
      auVar43 = vfnmadd213ps_avx512vl(auVar44,auVar42,auVar43);
      local_5b20 = ZEXT1632(auVar81);
      local_5b00 = ZEXT1632(auVar72);
      auVar69 = vfmadd132ps_fma(auVar43,auVar42,auVar42);
      local_5ae0 = ZEXT1632(auVar69);
      local_5ac0._4_4_ = (float)local_5be0._4_4_ * auVar81._4_4_;
      local_5ac0._0_4_ = (float)local_5be0._0_4_ * auVar81._0_4_;
      local_5ac0._8_4_ = (float)local_5be0._8_4_ * auVar81._8_4_;
      local_5ac0._12_4_ = (float)local_5be0._12_4_ * auVar81._12_4_;
      local_5ac0._16_4_ = (float)local_5be0._16_4_ * 0.0;
      local_5ac0._20_4_ = (float)local_5be0._20_4_ * 0.0;
      local_5ac0._24_4_ = (float)local_5be0._24_4_ * 0.0;
      local_5ac0._28_4_ = local_5be0._28_4_;
      local_5aa0._4_4_ = (float)local_5be0._36_4_ * auVar72._4_4_;
      local_5aa0._0_4_ = (float)local_5be0._32_4_ * auVar72._0_4_;
      local_5aa0._8_4_ = (float)local_5be0._40_4_ * auVar72._8_4_;
      local_5aa0._12_4_ = (float)local_5be0._44_4_ * auVar72._12_4_;
      local_5aa0._16_4_ = (float)local_5be0._48_4_ * 0.0;
      local_5aa0._20_4_ = (float)local_5be0._52_4_ * 0.0;
      local_5aa0._24_4_ = (float)local_5be0._56_4_ * 0.0;
      local_5aa0._28_4_ = local_5be0._60_4_;
      local_5a80._4_4_ = (float)local_5be0._68_4_ * auVar69._4_4_;
      local_5a80._0_4_ = (float)local_5be0._64_4_ * auVar69._0_4_;
      local_5a80._8_4_ = (float)local_5be0._72_4_ * auVar69._8_4_;
      local_5a80._12_4_ = (float)local_5be0._76_4_ * auVar69._12_4_;
      local_5a80._16_4_ = (float)local_5be0._80_4_ * 0.0;
      local_5a80._20_4_ = (float)local_5be0._84_4_ * 0.0;
      local_5a80._24_4_ = (float)local_5be0._88_4_ * 0.0;
      local_5a80._28_4_ = local_5be0._92_4_;
      uVar27 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar39),1);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_5a60._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * auVar42._4_4_;
      local_5a60._0_4_ = (uint)((byte)uVar27 & 1) * auVar42._0_4_;
      local_5a60._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * auVar42._8_4_;
      local_5a60._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * auVar42._12_4_;
      local_5a60._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * auVar42._16_4_;
      local_5a60._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * auVar42._20_4_;
      local_5a60._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * auVar42._24_4_;
      local_5a60._28_4_ = (uint)(byte)(uVar27 >> 7) * auVar42._28_4_;
      uVar27 = vcmpps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar39),5);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar33 = (bool)((byte)uVar27 & 1);
      local_5a40 = (uint)bVar33 * auVar42._0_4_ | (uint)!bVar33 * 0x60;
      bVar33 = (bool)((byte)(uVar27 >> 1) & 1);
      uStack_5a3c = (uint)bVar33 * auVar42._4_4_ | (uint)!bVar33 * 0x60;
      bVar33 = (bool)((byte)(uVar27 >> 2) & 1);
      uStack_5a38 = (uint)bVar33 * auVar42._8_4_ | (uint)!bVar33 * 0x60;
      bVar33 = (bool)((byte)(uVar27 >> 3) & 1);
      uStack_5a34 = (uint)bVar33 * auVar42._12_4_ | (uint)!bVar33 * 0x60;
      bVar33 = (bool)((byte)(uVar27 >> 4) & 1);
      uStack_5a30 = (uint)bVar33 * auVar42._16_4_ | (uint)!bVar33 * 0x60;
      bVar33 = (bool)((byte)(uVar27 >> 5) & 1);
      uStack_5a2c = (uint)bVar33 * auVar42._20_4_ | (uint)!bVar33 * 0x60;
      bVar33 = (bool)((byte)(uVar27 >> 6) & 1);
      uStack_5a28 = (uint)bVar33 * auVar42._24_4_ | (uint)!bVar33 * 0x60;
      bVar33 = SUB81(uVar27 >> 7,0);
      uStack_5a24 = (uint)bVar33 * auVar42._28_4_ | (uint)!bVar33 * 0x60;
      auVar43 = ZEXT1632(auVar39);
      uVar27 = vcmpps_avx512vl(ZEXT1632(auVar69),auVar43,5);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar33 = (bool)((byte)uVar27 & 1);
      local_5a20 = (uint)bVar33 * auVar42._0_4_ | (uint)!bVar33 * 0xa0;
      bVar33 = (bool)((byte)(uVar27 >> 1) & 1);
      uStack_5a1c = (uint)bVar33 * auVar42._4_4_ | (uint)!bVar33 * 0xa0;
      bVar33 = (bool)((byte)(uVar27 >> 2) & 1);
      uStack_5a18 = (uint)bVar33 * auVar42._8_4_ | (uint)!bVar33 * 0xa0;
      bVar33 = (bool)((byte)(uVar27 >> 3) & 1);
      uStack_5a14 = (uint)bVar33 * auVar42._12_4_ | (uint)!bVar33 * 0xa0;
      bVar33 = (bool)((byte)(uVar27 >> 4) & 1);
      uStack_5a10 = (uint)bVar33 * auVar42._16_4_ | (uint)!bVar33 * 0xa0;
      bVar33 = (bool)((byte)(uVar27 >> 5) & 1);
      uStack_5a0c = (uint)bVar33 * auVar42._20_4_ | (uint)!bVar33 * 0xa0;
      bVar33 = (bool)((byte)(uVar27 >> 6) & 1);
      uStack_5a08 = (uint)bVar33 * auVar42._24_4_ | (uint)!bVar33 * 0xa0;
      bVar33 = SUB81(uVar27 >> 7,0);
      uStack_5a04 = (uint)bVar33 * auVar42._28_4_ | (uint)!bVar33 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar102 = ZEXT3264(local_4680);
      auVar42 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar43);
      local_5a00._0_4_ =
           (uint)(bVar34 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar34 & 1) * local_4680._0_4_;
      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
      local_5a00._4_4_ = (uint)bVar33 * auVar42._4_4_ | (uint)!bVar33 * local_4680._4_4_;
      bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
      local_5a00._8_4_ = (uint)bVar33 * auVar42._8_4_ | (uint)!bVar33 * local_4680._8_4_;
      bVar33 = (bool)((byte)(uVar35 >> 3) & 1);
      local_5a00._12_4_ = (uint)bVar33 * auVar42._12_4_ | (uint)!bVar33 * local_4680._12_4_;
      bVar33 = (bool)((byte)(uVar35 >> 4) & 1);
      local_5a00._16_4_ = (uint)bVar33 * auVar42._16_4_ | (uint)!bVar33 * local_4680._16_4_;
      bVar33 = (bool)((byte)(uVar35 >> 5) & 1);
      local_5a00._20_4_ = (uint)bVar33 * auVar42._20_4_ | (uint)!bVar33 * local_4680._20_4_;
      bVar33 = (bool)((byte)(uVar35 >> 6) & 1);
      local_5a00._24_4_ = (uint)bVar33 * auVar42._24_4_ | (uint)!bVar33 * local_4680._24_4_;
      bVar33 = SUB81(uVar35 >> 7,0);
      local_5a00._28_4_ = (uint)bVar33 * auVar42._28_4_ | (uint)!bVar33 * local_4680._28_4_;
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar101 = ZEXT3264(auVar42);
      auVar46 = vmaxps_avx512vl(auVar46,auVar43);
      local_59e0._0_4_ =
           (uint)(bVar34 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar42._0_4_;
      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
      local_59e0._4_4_ = (uint)bVar33 * auVar46._4_4_ | (uint)!bVar33 * auVar42._4_4_;
      bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
      local_59e0._8_4_ = (uint)bVar33 * auVar46._8_4_ | (uint)!bVar33 * auVar42._8_4_;
      bVar33 = (bool)((byte)(uVar35 >> 3) & 1);
      local_59e0._12_4_ = (uint)bVar33 * auVar46._12_4_ | (uint)!bVar33 * auVar42._12_4_;
      bVar33 = (bool)((byte)(uVar35 >> 4) & 1);
      local_59e0._16_4_ = (uint)bVar33 * auVar46._16_4_ | (uint)!bVar33 * auVar42._16_4_;
      bVar33 = (bool)((byte)(uVar35 >> 5) & 1);
      local_59e0._20_4_ = (uint)bVar33 * auVar46._20_4_ | (uint)!bVar33 * auVar42._20_4_;
      bVar33 = (bool)((byte)(uVar35 >> 6) & 1);
      local_59e0._24_4_ = (uint)bVar33 * auVar46._24_4_ | (uint)!bVar33 * auVar42._24_4_;
      bVar33 = SUB81(uVar35 >> 7,0);
      local_59e0._28_4_ = (uint)bVar33 * auVar46._28_4_ | (uint)!bVar33 * auVar42._28_4_;
      bVar26 = ~bVar34;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 7;
      }
      else {
        uVar31 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      puVar30 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar32 = (undefined1 (*) [32])local_4640;
      local_5808 = (bvh->root).ptr;
      local_4660 = local_5a00;
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar103 = ZEXT3264(auVar46);
      do {
        pauVar32 = pauVar32 + -1;
        root.ptr = puVar30[-1];
        puVar30 = puVar30 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00883c34:
          iVar38 = 3;
        }
        else {
          auVar46 = *pauVar32;
          uVar35 = vcmpps_avx512vl(auVar46,local_59e0,1);
          if ((char)uVar35 == '\0') {
LAB_00883c38:
            iVar38 = 2;
          }
          else {
            uVar28 = (undefined4)uVar35;
            iVar38 = 0;
            if ((uint)POPCOUNT(uVar28) <= uVar31) {
              do {
                k = 0;
                for (uVar27 = uVar35; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000)
                {
                  k = k + 1;
                }
                auVar87 = ZEXT1664(auVar87._0_16_);
                auVar90 = ZEXT1664(auVar90._0_16_);
                bVar33 = occluded1(This,bvh,root,k,(Precalculations *)&local_59c0,ray,
                                   (TravRayK<8,_false> *)&local_5be0.field_0,context);
                bVar25 = (byte)(1 << ((uint)k & 0x1f));
                if (!bVar33) {
                  bVar25 = 0;
                }
                bVar26 = bVar26 | bVar25;
                uVar35 = uVar35 - 1 & uVar35;
              } while (uVar35 != 0);
              if (bVar26 == 0xff) {
                iVar38 = 3;
              }
              else {
                auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                local_59e0._0_4_ =
                     (uint)(bVar26 & 1) * auVar42._0_4_ |
                     (uint)!(bool)(bVar26 & 1) * local_59e0._0_4_;
                bVar33 = (bool)(bVar26 >> 1 & 1);
                local_59e0._4_4_ = (uint)bVar33 * auVar42._4_4_ | (uint)!bVar33 * local_59e0._4_4_;
                bVar33 = (bool)(bVar26 >> 2 & 1);
                local_59e0._8_4_ = (uint)bVar33 * auVar42._8_4_ | (uint)!bVar33 * local_59e0._8_4_;
                bVar33 = (bool)(bVar26 >> 3 & 1);
                local_59e0._12_4_ =
                     (uint)bVar33 * auVar42._12_4_ | (uint)!bVar33 * local_59e0._12_4_;
                bVar33 = (bool)(bVar26 >> 4 & 1);
                local_59e0._16_4_ =
                     (uint)bVar33 * auVar42._16_4_ | (uint)!bVar33 * local_59e0._16_4_;
                bVar33 = (bool)(bVar26 >> 5 & 1);
                local_59e0._20_4_ =
                     (uint)bVar33 * auVar42._20_4_ | (uint)!bVar33 * local_59e0._20_4_;
                bVar33 = (bool)(bVar26 >> 6 & 1);
                local_59e0._24_4_ =
                     (uint)bVar33 * auVar42._24_4_ | (uint)!bVar33 * local_59e0._24_4_;
                local_59e0._28_4_ =
                     (uint)(bVar26 >> 7) * auVar42._28_4_ |
                     (uint)!(bool)(bVar26 >> 7) * local_59e0._28_4_;
                iVar38 = 2;
              }
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar98 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar99 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar100 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar101 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar102 = ZEXT3264(auVar42);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar103 = ZEXT3264(auVar42);
            }
            if (uVar31 < (uint)POPCOUNT(uVar28)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00883c34;
                  uVar12 = vcmpps_avx512vl(auVar46,local_59e0,9);
                  if ((char)uVar12 != '\0') {
                    if (bVar26 == 0xff) {
                      bVar25 = 0;
                    }
                    else {
                      uVar35 = (ulong)(byte)~bVar26;
                      bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar3 = This->leafIntersector;
                      bVar25 = 0;
                      do {
                        lVar29 = 0;
                        for (uVar27 = uVar35; (uVar27 & 1) == 0;
                            uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                          lVar29 = lVar29 + 1;
                        }
                        auVar87 = ZEXT1664(auVar87._0_16_);
                        auVar90 = ZEXT1664(auVar90._0_16_);
                        cVar24 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x28))
                                           (&local_59c0,ray,lVar29,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        bVar20 = (byte)(1 << ((uint)lVar29 & 0x1f));
                        if (cVar24 == '\0') {
                          bVar20 = 0;
                        }
                        bVar25 = bVar25 | bVar20;
                        uVar35 = uVar35 - 1 & uVar35;
                      } while (uVar35 != 0);
                    }
                    bVar26 = bVar26 | bVar25;
                    if (bVar26 == 0xff) {
                      iVar38 = 3;
                    }
                    else {
                      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      local_59e0._0_4_ =
                           (uint)(bVar26 & 1) * auVar46._0_4_ |
                           (uint)!(bool)(bVar26 & 1) * local_59e0._0_4_;
                      bVar33 = (bool)(bVar26 >> 1 & 1);
                      local_59e0._4_4_ =
                           (uint)bVar33 * auVar46._4_4_ | (uint)!bVar33 * local_59e0._4_4_;
                      bVar33 = (bool)(bVar26 >> 2 & 1);
                      local_59e0._8_4_ =
                           (uint)bVar33 * auVar46._8_4_ | (uint)!bVar33 * local_59e0._8_4_;
                      bVar33 = (bool)(bVar26 >> 3 & 1);
                      local_59e0._12_4_ =
                           (uint)bVar33 * auVar46._12_4_ | (uint)!bVar33 * local_59e0._12_4_;
                      bVar33 = (bool)(bVar26 >> 4 & 1);
                      local_59e0._16_4_ =
                           (uint)bVar33 * auVar46._16_4_ | (uint)!bVar33 * local_59e0._16_4_;
                      bVar33 = (bool)(bVar26 >> 5 & 1);
                      local_59e0._20_4_ =
                           (uint)bVar33 * auVar46._20_4_ | (uint)!bVar33 * local_59e0._20_4_;
                      bVar33 = (bool)(bVar26 >> 6 & 1);
                      local_59e0._24_4_ =
                           (uint)bVar33 * auVar46._24_4_ | (uint)!bVar33 * local_59e0._24_4_;
                      local_59e0._28_4_ =
                           (uint)(bVar26 >> 7) * auVar46._28_4_ |
                           (uint)!(bool)(bVar26 >> 7) * local_59e0._28_4_;
                      iVar38 = 0;
                    }
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar98 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar99 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar100 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar101 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar102 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar103 = ZEXT3264(auVar46);
                    break;
                  }
                  goto LAB_00883c38;
                }
                uVar37 = root.ptr & 0xfffffffffffffff0;
                auVar104 = ZEXT3264(auVar102._0_32_);
                uVar35 = 0;
                uVar27 = 8;
                do {
                  uVar2 = *(ulong *)(uVar37 + uVar35 * 8);
                  if (uVar2 != 8) {
                    if ((root.ptr & 7) == 0) {
                      uVar28 = *(undefined4 *)(root.ptr + 0x40 + uVar35 * 4);
                      auVar70._4_4_ = uVar28;
                      auVar70._0_4_ = uVar28;
                      auVar70._8_4_ = uVar28;
                      auVar70._12_4_ = uVar28;
                      auVar70._16_4_ = uVar28;
                      auVar70._20_4_ = uVar28;
                      auVar70._24_4_ = uVar28;
                      auVar70._28_4_ = uVar28;
                      auVar72 = vfmsub132ps_fma(auVar70,local_5ac0,local_5b20);
                      uVar28 = *(undefined4 *)(root.ptr + 0x80 + uVar35 * 4);
                      auVar82._4_4_ = uVar28;
                      auVar82._0_4_ = uVar28;
                      auVar82._8_4_ = uVar28;
                      auVar82._12_4_ = uVar28;
                      auVar82._16_4_ = uVar28;
                      auVar82._20_4_ = uVar28;
                      auVar82._24_4_ = uVar28;
                      auVar82._28_4_ = uVar28;
                      auVar69 = vfmsub132ps_fma(auVar82,local_5aa0,local_5b00);
                      uVar28 = *(undefined4 *)(root.ptr + 0xc0 + uVar35 * 4);
                      auVar86._4_4_ = uVar28;
                      auVar86._0_4_ = uVar28;
                      auVar86._8_4_ = uVar28;
                      auVar86._12_4_ = uVar28;
                      auVar86._16_4_ = uVar28;
                      auVar86._20_4_ = uVar28;
                      auVar86._24_4_ = uVar28;
                      auVar86._28_4_ = uVar28;
                      uVar28 = *(undefined4 *)(root.ptr + 0x60 + uVar35 * 4);
                      auVar13._4_4_ = uVar28;
                      auVar13._0_4_ = uVar28;
                      auVar13._8_4_ = uVar28;
                      auVar13._12_4_ = uVar28;
                      auVar13._16_4_ = uVar28;
                      auVar13._20_4_ = uVar28;
                      auVar13._24_4_ = uVar28;
                      auVar13._28_4_ = uVar28;
                      auVar43 = vfmsub132ps_avx512vl(local_5b20,local_5ac0,auVar13);
                      uVar28 = *(undefined4 *)(root.ptr + 0xa0 + uVar35 * 4);
                      auVar14._4_4_ = uVar28;
                      auVar14._0_4_ = uVar28;
                      auVar14._8_4_ = uVar28;
                      auVar14._12_4_ = uVar28;
                      auVar14._16_4_ = uVar28;
                      auVar14._20_4_ = uVar28;
                      auVar14._24_4_ = uVar28;
                      auVar14._28_4_ = uVar28;
                      auVar45 = vfmsub132ps_avx512vl(local_5b00,local_5aa0,auVar14);
                      auVar81 = vfmsub132ps_fma(auVar86,local_5a80,local_5ae0);
                      uVar28 = *(undefined4 *)(root.ptr + 0xe0 + uVar35 * 4);
                      auVar15._4_4_ = uVar28;
                      auVar15._0_4_ = uVar28;
                      auVar15._8_4_ = uVar28;
                      auVar15._12_4_ = uVar28;
                      auVar15._16_4_ = uVar28;
                      auVar15._20_4_ = uVar28;
                      auVar15._24_4_ = uVar28;
                      auVar15._28_4_ = uVar28;
                      auVar41 = vfmsub132ps_avx512vl(local_5ae0,local_5a80,auVar15);
                      auVar46 = vpminsd_avx2(ZEXT1632(auVar72),auVar43);
                      auVar42 = vpminsd_avx2(ZEXT1632(auVar69),auVar45);
                      auVar46 = vpmaxsd_avx2(auVar46,auVar42);
                      auVar42 = vpminsd_avx2(ZEXT1632(auVar81),auVar41);
                      auVar46 = vpmaxsd_avx2(auVar46,auVar42);
                      auVar42 = vpmaxsd_avx2(ZEXT1632(auVar72),auVar43);
                      auVar43 = vpmaxsd_avx2(ZEXT1632(auVar69),auVar45);
                      auVar43 = vpminsd_avx2(auVar42,auVar43);
                      auVar42 = vpmaxsd_avx2(ZEXT1632(auVar81),auVar41);
                      auVar43 = vpminsd_avx2(auVar43,auVar42);
                      auVar42 = vpmaxsd_avx2(auVar46,local_5a00);
                      auVar43 = vpminsd_avx2(auVar43,local_59e0);
                      uVar36 = vpcmpd_avx512vl(auVar42,auVar43,2);
                    }
                    else {
                      fVar11 = *(float *)(uVar37 + 0x40 + uVar35 * 4);
                      auVar61._4_4_ = fVar11;
                      auVar61._0_4_ = fVar11;
                      auVar61._8_4_ = fVar11;
                      auVar61._12_4_ = fVar11;
                      auVar61._16_4_ = fVar11;
                      auVar61._20_4_ = fVar11;
                      auVar61._24_4_ = fVar11;
                      auVar61._28_4_ = fVar11;
                      uVar28 = *(undefined4 *)(uVar37 + 0x60 + uVar35 * 4);
                      auVar59._4_4_ = uVar28;
                      auVar59._0_4_ = uVar28;
                      auVar59._8_4_ = uVar28;
                      auVar59._12_4_ = uVar28;
                      auVar59._16_4_ = uVar28;
                      auVar59._20_4_ = uVar28;
                      auVar59._24_4_ = uVar28;
                      auVar59._28_4_ = uVar28;
                      uVar28 = *(undefined4 *)(uVar37 + 0x80 + uVar35 * 4);
                      auVar58._4_4_ = uVar28;
                      auVar58._0_4_ = uVar28;
                      auVar58._8_4_ = uVar28;
                      auVar58._12_4_ = uVar28;
                      auVar58._16_4_ = uVar28;
                      auVar58._20_4_ = uVar28;
                      auVar58._24_4_ = uVar28;
                      auVar58._28_4_ = uVar28;
                      uVar28 = *(undefined4 *)(uVar37 + 0xa0 + uVar35 * 4);
                      auVar95._4_4_ = uVar28;
                      auVar95._0_4_ = uVar28;
                      auVar95._8_4_ = uVar28;
                      auVar95._12_4_ = uVar28;
                      auVar95._16_4_ = uVar28;
                      auVar95._20_4_ = uVar28;
                      auVar95._24_4_ = uVar28;
                      auVar95._28_4_ = uVar28;
                      uVar28 = *(undefined4 *)(uVar37 + 0xc0 + uVar35 * 4);
                      auVar93._4_4_ = uVar28;
                      auVar93._0_4_ = uVar28;
                      auVar93._8_4_ = uVar28;
                      auVar93._12_4_ = uVar28;
                      auVar93._16_4_ = uVar28;
                      auVar93._20_4_ = uVar28;
                      auVar93._24_4_ = uVar28;
                      auVar93._28_4_ = uVar28;
                      uVar28 = *(undefined4 *)(uVar37 + 0xe0 + uVar35 * 4);
                      auVar85._4_4_ = uVar28;
                      auVar85._0_4_ = uVar28;
                      auVar85._8_4_ = uVar28;
                      auVar85._12_4_ = uVar28;
                      auVar85._16_4_ = uVar28;
                      auVar85._20_4_ = uVar28;
                      auVar85._24_4_ = uVar28;
                      auVar85._28_4_ = uVar28;
                      fVar60 = *(float *)(uVar37 + 0x100 + uVar35 * 4);
                      auVar83._4_4_ = fVar60;
                      auVar83._0_4_ = fVar60;
                      auVar83._8_4_ = fVar60;
                      auVar83._12_4_ = fVar60;
                      auVar83._16_4_ = fVar60;
                      auVar83._20_4_ = fVar60;
                      auVar83._24_4_ = fVar60;
                      auVar83._28_4_ = fVar60;
                      fVar62 = *(float *)(uVar37 + 0x120 + uVar35 * 4);
                      auVar73._4_4_ = fVar62;
                      auVar73._0_4_ = fVar62;
                      auVar73._8_4_ = fVar62;
                      auVar73._12_4_ = fVar62;
                      auVar73._16_4_ = fVar62;
                      auVar73._20_4_ = fVar62;
                      auVar73._24_4_ = fVar62;
                      auVar73._28_4_ = fVar62;
                      fVar63 = *(float *)(uVar37 + 0x140 + uVar35 * 4);
                      auVar68._4_4_ = fVar63;
                      auVar68._0_4_ = fVar63;
                      auVar68._8_4_ = fVar63;
                      auVar68._12_4_ = fVar63;
                      auVar68._16_4_ = fVar63;
                      auVar68._20_4_ = fVar63;
                      auVar68._24_4_ = fVar63;
                      auVar68._28_4_ = fVar63;
                      auVar21._4_4_ = local_5be0._4_4_;
                      auVar21._0_4_ = local_5be0._0_4_;
                      auVar21._8_4_ = local_5be0._8_4_;
                      auVar21._12_4_ = local_5be0._12_4_;
                      auVar21._16_4_ = local_5be0._16_4_;
                      auVar21._20_4_ = local_5be0._20_4_;
                      auVar21._24_4_ = local_5be0._24_4_;
                      auVar21._28_4_ = local_5be0._28_4_;
                      auVar22._4_4_ = local_5be0._36_4_;
                      auVar22._0_4_ = local_5be0._32_4_;
                      auVar22._8_4_ = local_5be0._40_4_;
                      auVar22._12_4_ = local_5be0._44_4_;
                      auVar22._16_4_ = local_5be0._48_4_;
                      auVar22._20_4_ = local_5be0._52_4_;
                      auVar22._24_4_ = local_5be0._56_4_;
                      auVar22._28_4_ = local_5be0._60_4_;
                      auVar23._4_4_ = local_5be0._68_4_;
                      auVar23._0_4_ = local_5be0._64_4_;
                      auVar23._8_4_ = local_5be0._72_4_;
                      auVar23._12_4_ = local_5be0._76_4_;
                      auVar23._16_4_ = local_5be0._80_4_;
                      auVar23._20_4_ = local_5be0._84_4_;
                      auVar23._24_4_ = local_5be0._88_4_;
                      auVar23._28_4_ = local_5be0._92_4_;
                      auVar87._0_4_ = (float)local_5b40._0_4_ * fVar60;
                      auVar87._4_4_ = (float)local_5b40._4_4_ * fVar60;
                      auVar87._8_4_ = fStack_5b38 * fVar60;
                      auVar87._12_4_ = fStack_5b34 * fVar60;
                      auVar87._16_4_ = fStack_5b30 * fVar60;
                      auVar87._20_4_ = fStack_5b2c * fVar60;
                      auVar87._24_4_ = fStack_5b28 * fVar60;
                      auVar91._0_4_ = (float)local_5b40._0_4_ * fVar62;
                      auVar91._4_4_ = (float)local_5b40._4_4_ * fVar62;
                      auVar91._8_4_ = fStack_5b38 * fVar62;
                      auVar91._12_4_ = fStack_5b34 * fVar62;
                      auVar91._16_4_ = fStack_5b30 * fVar62;
                      auVar91._20_4_ = fStack_5b2c * fVar62;
                      auVar91._28_36_ = auVar90._28_36_;
                      auVar91._24_4_ = fStack_5b28 * fVar62;
                      auVar18._4_4_ = (float)local_5b40._4_4_ * fVar63;
                      auVar18._0_4_ = (float)local_5b40._0_4_ * fVar63;
                      auVar18._8_4_ = fStack_5b38 * fVar63;
                      auVar18._12_4_ = fStack_5b34 * fVar63;
                      auVar18._16_4_ = fStack_5b30 * fVar63;
                      auVar18._20_4_ = fStack_5b2c * fVar63;
                      auVar18._24_4_ = fStack_5b28 * fVar63;
                      auVar18._28_4_ = uStack_5b24;
                      auVar46 = vfmadd231ps_avx512vl(auVar87._0_32_,local_5b60,auVar95);
                      auVar42 = vfmadd231ps_avx512vl(auVar91._0_32_,local_5b60,auVar93);
                      auVar43 = vfmadd231ps_avx512vl(auVar18,auVar85,local_5b60);
                      auVar81 = vfmadd231ps_fma(auVar46,local_5b80,auVar61);
                      auVar72 = vfmadd231ps_fma(auVar42,local_5b80,auVar59);
                      auVar69 = vfmadd231ps_fma(auVar43,auVar58,local_5b80);
                      auVar46 = auVar98._0_32_;
                      vandps_avx512vl(ZEXT1632(auVar81),auVar46);
                      auVar42 = auVar99._0_32_;
                      uVar36 = vcmpps_avx512vl(auVar43,auVar42,1);
                      bVar33 = (bool)((byte)uVar36 & 1);
                      iVar38 = auVar99._0_4_;
                      auVar47._0_4_ = (uint)bVar33 * iVar38 | (uint)!bVar33 * auVar81._0_4_;
                      bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
                      iVar51 = auVar99._4_4_;
                      auVar47._4_4_ = (uint)bVar33 * iVar51 | (uint)!bVar33 * auVar81._4_4_;
                      bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
                      iVar52 = auVar99._8_4_;
                      auVar47._8_4_ = (uint)bVar33 * iVar52 | (uint)!bVar33 * auVar81._8_4_;
                      bVar33 = (bool)((byte)(uVar36 >> 3) & 1);
                      iVar53 = auVar99._12_4_;
                      auVar47._12_4_ = (uint)bVar33 * iVar53 | (uint)!bVar33 * auVar81._12_4_;
                      iVar54 = auVar99._16_4_;
                      auVar47._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * iVar54;
                      iVar55 = auVar99._20_4_;
                      auVar47._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * iVar55;
                      iVar56 = auVar99._24_4_;
                      iVar57 = auVar99._28_4_;
                      auVar47._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * iVar56;
                      auVar47._28_4_ = (uint)(byte)(uVar36 >> 7) * iVar57;
                      vandps_avx512vl(ZEXT1632(auVar72),auVar46);
                      uVar36 = vcmpps_avx512vl(auVar47,auVar42,1);
                      bVar33 = (bool)((byte)uVar36 & 1);
                      auVar48._0_4_ = (uint)bVar33 * iVar38 | (uint)!bVar33 * auVar72._0_4_;
                      bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
                      auVar48._4_4_ = (uint)bVar33 * iVar51 | (uint)!bVar33 * auVar72._4_4_;
                      bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
                      auVar48._8_4_ = (uint)bVar33 * iVar52 | (uint)!bVar33 * auVar72._8_4_;
                      bVar33 = (bool)((byte)(uVar36 >> 3) & 1);
                      auVar48._12_4_ = (uint)bVar33 * iVar53 | (uint)!bVar33 * auVar72._12_4_;
                      auVar48._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * iVar54;
                      auVar48._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * iVar55;
                      auVar48._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * iVar56;
                      auVar48._28_4_ = (uint)(byte)(uVar36 >> 7) * iVar57;
                      vandps_avx512vl(ZEXT1632(auVar69),auVar46);
                      uVar36 = vcmpps_avx512vl(auVar48,auVar42,1);
                      bVar33 = (bool)((byte)uVar36 & 1);
                      auVar49._0_4_ = (uint)bVar33 * iVar38 | (uint)!bVar33 * auVar69._0_4_;
                      bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
                      auVar49._4_4_ = (uint)bVar33 * iVar51 | (uint)!bVar33 * auVar69._4_4_;
                      bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
                      auVar49._8_4_ = (uint)bVar33 * iVar52 | (uint)!bVar33 * auVar69._8_4_;
                      bVar33 = (bool)((byte)(uVar36 >> 3) & 1);
                      auVar49._12_4_ = (uint)bVar33 * iVar53 | (uint)!bVar33 * auVar69._12_4_;
                      auVar49._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * iVar54;
                      auVar49._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * iVar55;
                      auVar49._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * iVar56;
                      auVar49._28_4_ = (uint)(byte)(uVar36 >> 7) * iVar57;
                      auVar46 = vrcp14ps_avx512vl(auVar47);
                      auVar43 = auVar100._0_32_;
                      auVar42 = vfnmadd213ps_avx512vl(auVar47,auVar46,auVar43);
                      auVar81 = vfmadd132ps_fma(auVar42,auVar46,auVar46);
                      auVar46 = vrcp14ps_avx512vl(auVar48);
                      auVar42 = vfnmadd213ps_avx512vl(auVar48,auVar46,auVar43);
                      auVar72 = vfmadd132ps_fma(auVar42,auVar46,auVar46);
                      auVar90 = ZEXT1664(auVar72);
                      auVar46 = vrcp14ps_avx512vl(auVar49);
                      auVar42 = vfnmadd213ps_avx512vl(auVar49,auVar46,auVar43);
                      auVar69 = vfmadd132ps_fma(auVar42,auVar46,auVar46);
                      auVar41 = auVar103._0_32_;
                      auVar42 = vxorps_avx512vl(ZEXT1632(auVar81),auVar41);
                      auVar43 = vxorps_avx512vl(ZEXT1632(auVar72),auVar41);
                      uVar28 = *(undefined4 *)(uVar37 + 0x160 + uVar35 * 4);
                      auVar46._4_4_ = uVar28;
                      auVar46._0_4_ = uVar28;
                      auVar46._8_4_ = uVar28;
                      auVar46._12_4_ = uVar28;
                      auVar46._16_4_ = uVar28;
                      auVar46._20_4_ = uVar28;
                      auVar46._24_4_ = uVar28;
                      auVar46._28_4_ = uVar28;
                      auVar46 = vfmadd213ps_avx512vl(auVar83,auVar23,auVar46);
                      uVar28 = *(undefined4 *)(uVar37 + 0x180 + uVar35 * 4);
                      auVar16._4_4_ = uVar28;
                      auVar16._0_4_ = uVar28;
                      auVar16._8_4_ = uVar28;
                      auVar16._12_4_ = uVar28;
                      auVar16._16_4_ = uVar28;
                      auVar16._20_4_ = uVar28;
                      auVar16._24_4_ = uVar28;
                      auVar16._28_4_ = uVar28;
                      auVar45 = vfmadd213ps_avx512vl(auVar73,auVar23,auVar16);
                      auVar41 = vxorps_avx512vl(ZEXT1632(auVar69),auVar41);
                      uVar28 = *(undefined4 *)(uVar37 + 0x1a0 + uVar35 * 4);
                      auVar17._4_4_ = uVar28;
                      auVar17._0_4_ = uVar28;
                      auVar17._8_4_ = uVar28;
                      auVar17._12_4_ = uVar28;
                      auVar17._16_4_ = uVar28;
                      auVar17._20_4_ = uVar28;
                      auVar17._24_4_ = uVar28;
                      auVar17._28_4_ = uVar28;
                      auVar50 = vfmadd213ps_avx512vl(auVar68,auVar23,auVar17);
                      auVar39 = vfmadd231ps_fma(auVar46,auVar22,auVar95);
                      auVar89 = vfmadd231ps_fma(auVar45,auVar22,auVar93);
                      auVar40 = vfmadd231ps_fma(auVar50,auVar22,auVar85);
                      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar21,auVar61);
                      fVar60 = auVar42._0_4_ * auVar39._0_4_;
                      fVar62 = auVar42._4_4_ * auVar39._4_4_;
                      auVar19._4_4_ = fVar62;
                      auVar19._0_4_ = fVar60;
                      fVar63 = auVar42._8_4_ * auVar39._8_4_;
                      auVar19._8_4_ = fVar63;
                      fVar64 = auVar42._12_4_ * auVar39._12_4_;
                      auVar19._12_4_ = fVar64;
                      fVar65 = auVar42._16_4_ * 0.0;
                      auVar19._16_4_ = fVar65;
                      fVar66 = auVar42._20_4_ * 0.0;
                      auVar19._20_4_ = fVar66;
                      fVar67 = auVar42._24_4_ * 0.0;
                      auVar19._24_4_ = fVar67;
                      auVar19._28_4_ = fVar11;
                      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar21,auVar59);
                      auVar43 = vmulps_avx512vl(ZEXT1632(auVar39),auVar43);
                      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar21,auVar58);
                      auVar45 = vmulps_avx512vl(ZEXT1632(auVar39),auVar41);
                      auVar71._0_4_ = auVar81._0_4_ + fVar60;
                      auVar71._4_4_ = auVar81._4_4_ + fVar62;
                      auVar71._8_4_ = auVar81._8_4_ + fVar63;
                      auVar71._12_4_ = auVar81._12_4_ + fVar64;
                      auVar71._16_4_ = fVar65 + 0.0;
                      auVar71._20_4_ = fVar66 + 0.0;
                      auVar71._24_4_ = fVar67 + 0.0;
                      auVar71._28_4_ = fVar11 + 0.0;
                      auVar74._0_4_ = auVar72._0_4_ + auVar43._0_4_;
                      auVar74._4_4_ = auVar72._4_4_ + auVar43._4_4_;
                      auVar74._8_4_ = auVar72._8_4_ + auVar43._8_4_;
                      auVar74._12_4_ = auVar72._12_4_ + auVar43._12_4_;
                      auVar74._16_4_ = auVar43._16_4_ + 0.0;
                      auVar74._20_4_ = auVar43._20_4_ + 0.0;
                      auVar74._24_4_ = auVar43._24_4_ + 0.0;
                      auVar74._28_4_ = auVar43._28_4_ + 0.0;
                      auVar84._0_4_ = auVar69._0_4_ + auVar45._0_4_;
                      auVar84._4_4_ = auVar69._4_4_ + auVar45._4_4_;
                      auVar84._8_4_ = auVar69._8_4_ + auVar45._8_4_;
                      auVar84._12_4_ = auVar69._12_4_ + auVar45._12_4_;
                      auVar84._16_4_ = auVar45._16_4_ + 0.0;
                      auVar84._20_4_ = auVar45._20_4_ + 0.0;
                      auVar84._24_4_ = auVar45._24_4_ + 0.0;
                      auVar84._28_4_ = auVar45._28_4_ + 0.0;
                      auVar46 = vpminsd_avx2(auVar19,auVar71);
                      auVar42 = vpminsd_avx2(auVar43,auVar74);
                      auVar46 = vpmaxsd_avx2(auVar46,auVar42);
                      auVar42 = vpminsd_avx2(auVar45,auVar84);
                      auVar46 = vpmaxsd_avx2(auVar46,auVar42);
                      auVar42 = vpmaxsd_avx2(auVar19,auVar71);
                      auVar43 = vpmaxsd_avx2(auVar43,auVar74);
                      auVar43 = vpminsd_avx2(auVar42,auVar43);
                      auVar42 = vpmaxsd_avx2(auVar45,auVar84);
                      auVar43 = vpminsd_avx2(auVar43,auVar42);
                      auVar42 = vpmaxsd_avx2(auVar46,local_5a00);
                      auVar43 = vpminsd_avx2(auVar43,local_59e0);
                      uVar36 = vcmpps_avx512vl(auVar42,auVar43,2);
                    }
                    auVar87 = ZEXT1664(auVar81);
                    if ((byte)uVar36 != 0) {
                      auVar42 = vblendmps_avx512vl(auVar102._0_32_,auVar46);
                      bVar33 = (bool)((byte)uVar36 & 1);
                      bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar6 = (bool)((byte)(uVar36 >> 3) & 1);
                      bVar7 = (bool)((byte)(uVar36 >> 4) & 1);
                      bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
                      bVar9 = (bool)((byte)(uVar36 >> 6) & 1);
                      bVar10 = SUB81(uVar36 >> 7,0);
                      if (uVar27 != 8) {
                        *puVar30 = uVar27;
                        puVar30 = puVar30 + 1;
                        *pauVar32 = auVar104._0_32_;
                        pauVar32 = pauVar32 + 1;
                      }
                      auVar104 = ZEXT3264(CONCAT428((uint)bVar10 * auVar42._28_4_ |
                                                    (uint)!bVar10 * auVar46._28_4_,
                                                    CONCAT424((uint)bVar9 * auVar42._24_4_ |
                                                              (uint)!bVar9 * auVar46._24_4_,
                                                              CONCAT420((uint)bVar8 * auVar42._20_4_
                                                                        | (uint)!bVar8 *
                                                                          auVar46._20_4_,
                                                                        CONCAT416((uint)bVar7 *
                                                                                  auVar42._16_4_ |
                                                                                  (uint)!bVar7 *
                                                                                  auVar46._16_4_,
                                                                                  CONCAT412((uint)
                                                  bVar6 * auVar42._12_4_ |
                                                  (uint)!bVar6 * auVar46._12_4_,
                                                  CONCAT48((uint)bVar5 * auVar42._8_4_ |
                                                           (uint)!bVar5 * auVar46._8_4_,
                                                           CONCAT44((uint)bVar4 * auVar42._4_4_ |
                                                                    (uint)!bVar4 * auVar46._4_4_,
                                                                    (uint)bVar33 * auVar42._0_4_ |
                                                                    (uint)!bVar33 * auVar46._0_4_)))
                                                  )))));
                      uVar27 = uVar2;
                    }
                  }
                  auVar46 = auVar104._0_32_;
                } while ((uVar2 != 8) && (bVar33 = uVar35 < 7, uVar35 = uVar35 + 1, bVar33));
                iVar38 = 0;
                if (uVar27 == 8) {
LAB_00883ad8:
                  bVar33 = false;
                  iVar38 = 4;
                }
                else {
                  uVar12 = vcmpps_avx512vl(auVar46,local_59e0,9);
                  bVar33 = true;
                  if ((uint)POPCOUNT((int)uVar12) <= uVar31) {
                    *puVar30 = uVar27;
                    puVar30 = puVar30 + 1;
                    *pauVar32 = auVar46;
                    pauVar32 = pauVar32 + 1;
                    goto LAB_00883ad8;
                  }
                }
                root.ptr = uVar27;
              } while (bVar33);
            }
          }
        }
      } while (iVar38 != 3);
      bVar26 = bVar26 & bVar34;
      bVar33 = (bool)(bVar26 >> 1 & 1);
      bVar4 = (bool)(bVar26 >> 2 & 1);
      bVar5 = (bool)(bVar26 >> 3 & 1);
      bVar6 = (bool)(bVar26 >> 4 & 1);
      bVar7 = (bool)(bVar26 >> 5 & 1);
      bVar8 = (bool)(bVar26 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(bVar26 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar26 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar33 * auVar101._4_4_ | (uint)!bVar33 * *(int *)(ray + 0x104)
      ;
      *(uint *)(ray + 0x108) = (uint)bVar4 * auVar101._8_4_ | (uint)!bVar4 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar5 * auVar101._12_4_ | (uint)!bVar5 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar6 * auVar101._16_4_ | (uint)!bVar6 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar7 * auVar101._20_4_ | (uint)!bVar7 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar8 * auVar101._24_4_ | (uint)!bVar8 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(bVar26 >> 7) * auVar101._28_4_ |
           (uint)!(bool)(bVar26 >> 7) * *(int *)(ray + 0x11c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }